

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O3

void __thiscall
RootIndexProxyModelPrivate::onLayoutChanged
          (RootIndexProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QModelIndex *pQVar1;
  QModelIndex *pQVar2;
  QModelIndex childIdx;
  QList<QPersistentModelIndex> *pQVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  RootIndexProxyModelPrivate *this_00;
  QPersistentModelIndex *this_01;
  long lVar8;
  long lVar9;
  QList<QPersistentModelIndex> parents;
  QModelIndex mappedParent;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  QList<QPersistentModelIndex> *local_80;
  QModelIndex local_78;
  QModelIndex local_60;
  Data *local_48;
  QPersistentModelIndex *pQStack_40;
  QAbstractItemModel *local_38;
  
  pQVar1 = (QModelIndex *)this->q_ptr;
  local_80 = sourceParents;
  if (0 < (this->proxyIndexes).d.size) {
    lVar7 = 0;
    lVar8 = 0;
    lVar9 = 0;
    do {
      pQVar2 = (this->proxyIndexes).d.ptr;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_78,
                 (QPersistentModelIndex *)
                 ((long)&((this->layoutChangePersistentIndexes).d.ptr)->d + lVar8));
      (**(code **)(*(long *)pQVar1 + 0x198))(&local_98,pQVar1,&local_78);
      QAbstractItemModel::changePersistentIndex(pQVar1,(QModelIndex *)((long)&pQVar2->r + lVar7));
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 8;
      lVar7 = lVar7 + 0x18;
    } while (lVar9 < (this->proxyIndexes).d.size);
  }
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  QList<QModelIndex>::clear(&this->proxyIndexes);
  pQVar3 = local_80;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QPersistentModelIndex *)0x0;
  local_98.size = 0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_98,(local_80->d).size);
  lVar7 = (pQVar3->d).size;
  if (lVar7 != 0) {
    this_01 = (pQVar3->d).ptr;
    lVar7 = lVar7 << 3;
    bVar6 = false;
    do {
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 == '\0') {
LAB_0013c42b:
        bVar5 = !bVar6;
        bVar6 = true;
        if (bVar5) {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78);
          QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                    ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,
                     (QPersistentModelIndex *)&local_78);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
        }
      }
      else {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_48,&this->m_rootIndex);
        this_00 = (RootIndexProxyModelPrivate *)&local_78;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_01);
        childIdx.i = (quintptr)pQStack_40;
        childIdx._0_8_ = local_48;
        childIdx.m = local_38;
        bVar5 = isDescendant(this_00,childIdx,&local_78);
        if (bVar5) goto LAB_0013c42b;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,this_01);
        (**(code **)(*(long *)pQVar1 + 0x198))
                  ((RootIndexProxyModelPrivate *)&local_78,pQVar1,&local_60);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_60,&local_78);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,
                   (QPersistentModelIndex *)&local_60);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_60);
      }
      this_01 = this_01 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  QAbstractItemModel::layoutChanged((QList *)pQVar1,(LayoutChangeHint)&local_98);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(RootIndexProxyModel);
    for (int i = 0; i < proxyIndexes.size(); ++i)
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();
    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    bool addedInvalidIndex = false;
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid() || isDescendant(m_rootIndex, parent)) {
            if (!addedInvalidIndex) {
                addedInvalidIndex = true;
                parents << QPersistentModelIndex();
            }
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }
    q->layoutChanged(parents, hint);
}